

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

FIOBJ headers2str(http_s *h,uintptr_t padding)

{
  uintptr_t uVar1;
  char cVar2;
  size_t sVar3;
  FIOBJ FVar4;
  fiobj_object_vtable_s *pfVar5;
  uint *in_RCX;
  code *pcVar6;
  fiobj_object_vtable_s *pfVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  _func_int_FIOBJ_void_ptr *extraout_RDX;
  _func_int_FIOBJ_void_ptr *extraout_RDX_00;
  _func_int_FIOBJ_void_ptr *extraout_RDX_01;
  _func_int_FIOBJ_void_ptr *extraout_RDX_02;
  _func_int_FIOBJ_void_ptr *extraout_RDX_03;
  char *pcVar11;
  char *data;
  bool bVar12;
  fio_str_info_s ret;
  header_writer_s w;
  fio_str_info_s local_48;
  FIOBJ local_28 [3];
  _func_int_FIOBJ_void_ptr *task;
  
  if ((h->method == 0) && (h->status_str != 0)) {
    return 0;
  }
  if (headers2str::connection_hash == 0) {
    pcVar6 = fiobj_free_complex_object;
    headers2str::connection_hash = fio_siphash13("connection",10,0x144e87,0x1453b6);
    in_RCX = (uint *)pcVar6;
  }
  sVar3 = fiobj_hash_count((h->private_data).out_headers);
  local_28[0] = fiobj_str_buf(padding + sVar3 * 0x40);
  uVar1 = (h->private_data).flag;
  if (*(char *)(uVar1 + 0x101) != '\0') {
    if (h->method == 0) {
      pcVar11 = "GET ";
      sVar3 = 4;
    }
    else {
      fiobj_str_concat(local_28[0],h->method);
      pcVar11 = " ";
      sVar3 = 1;
    }
    fiobj_str_write(local_28[0],pcVar11,sVar3);
    fiobj_str_concat(local_28[0],h->path);
    if (h->query != 0) {
      fiobj_str_write(local_28[0],"?",1);
      fiobj_str_concat(local_28[0],h->query);
    }
    fiobj_str_write(local_28[0]," HTTP/1.1\r\n",0xb);
    if (headers2str::host_hash == 0) {
      pcVar6 = fiobj_free_complex_object;
      headers2str::host_hash = fio_siphash13("host",4,0x144e87,0x1453b6);
      in_RCX = (uint *)pcVar6;
    }
    FVar4 = fiobj_hash_get2((h->private_data).out_headers,headers2str::host_hash);
    if ((FVar4 == 0) && (FVar4 = fiobj_hash_get2(h->headers,headers2str::host_hash), FVar4 != 0)) {
      fiobj_str_write(local_28[0],"host:",5);
      fiobj_str_concat(local_28[0],FVar4);
      fiobj_str_write(local_28[0],"\r\n",2);
    }
    FVar4 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
    task = extraout_RDX;
    if (FVar4 != 0) goto LAB_00150bd8;
LAB_001507fd:
    fiobj_str_write(local_28[0],"connection:keep-alive\r\n",0x17);
    task = extraout_RDX_00;
    goto LAB_00150bd8;
  }
  in_RCX = (uint *)0x0;
  pcVar11 = (char *)0x0;
  if (99 < h->status) {
    uVar10 = h->status - 100;
    in_RCX = (uint *)0x0;
    pcVar11 = (char *)0x0;
    if (uVar10 < 0x19c) {
      in_RCX = *(uint **)(http1pr_status2str_status2str + uVar10 * 0x18 + 8);
      pcVar11 = *(char **)(http1pr_status2str_status2str + uVar10 * 0x18 + 0x10);
    }
  }
  pfVar7 = (fiobj_object_vtable_s *)0x24;
  if (pcVar11 != (char *)0x0) {
    pfVar7 = (fiobj_object_vtable_s *)in_RCX;
  }
  data = "HTTP/1.1 500 Internal Server Error\r\n";
  if (pcVar11 != (char *)0x0) {
    data = pcVar11;
  }
  fiobj_str_write(local_28[0],data,(size_t)pfVar7);
  FVar4 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
  if (FVar4 == 0) {
    FVar4 = fiobj_hash_get2(h->headers,headers2str::connection_hash);
    if (FVar4 == 0) {
      uVar10 = h->version;
      pfVar7 = (fiobj_object_vtable_s *)in_RCX;
      if (uVar10 == 0) {
LAB_001509f8:
        local_48.data = anon_var_dwarf_20f;
        local_48.len._0_4_ = 4;
        in_RCX = (uint *)pfVar7;
        goto LAB_00150a0b;
      }
      if ((uVar10 & 1) == 0) {
        uVar8 = (uint)uVar10 & 6;
        pfVar7 = (fiobj_object_vtable_s *)(ulong)uVar8;
        cVar2 = '(';
        switch(uVar8) {
        case 0:
switchD_00150891_caseD_0:
          cVar2 = *(char *)(uVar10 & 0xfffffffffffffff8);
          break;
        case 4:
switchD_00150891_caseD_4:
          cVar2 = '*';
          break;
        case 6:
          in_RCX = (uint *)pfVar7;
          if ((char)uVar10 == '&') {
            local_48.data = anon_var_dwarf_21a;
            local_48.len._0_4_ = 5;
          }
          else {
            uVar9 = (uint)uVar10 & 0xff;
            if (uVar9 != 0x16) {
              if (uVar9 == 6) goto LAB_001509f8;
              pfVar7 = (fiobj_object_vtable_s *)
                       ((long)&switchD_00150b1f::switchdataD_0016a1c4 +
                       (long)(int)(&switchD_00150b1f::switchdataD_0016a1c4)[(long)pfVar7]);
              switch(uVar8) {
              case 0:
                goto switchD_00150891_caseD_0;
              case 4:
                goto switchD_00150891_caseD_4;
              case 6:
                cVar2 = (char)uVar10;
              }
              break;
            }
            local_48.data = anon_var_dwarf_225;
            local_48.len._0_4_ = 4;
          }
LAB_00150a0b:
          local_48.capa._0_4_ = 0;
          local_48.capa._4_4_ = 0;
          local_48.len._4_4_ = 0;
          goto LAB_00150b78;
        }
        in_RCX = &switchD_00150b3c::switchdataD_0016a1e0;
        switch(cVar2) {
        case '\'':
          pfVar5 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          pfVar5 = &FIOBJECT_VTABLE_STRING;
          break;
        case ')':
          pfVar5 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          pfVar5 = &FIOBJECT_VTABLE_HASH;
          break;
        case '+':
          pfVar5 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
          in_RCX = (uint *)pfVar7;
        }
        (*pfVar5->to_str)(&local_48,uVar10);
      }
      else {
        fio_ltocstr(&local_48,(long)uVar10 >> 1);
      }
LAB_00150b78:
      bVar12 = *(char *)(uVar1 + 0x100) == '\0';
      in_RCX = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar12);
      if ((((((byte *)local_48.data != (byte *)0x0 &&
             7 < CONCAT44(local_48.len._4_4_,(undefined4)local_48.len)) && bVar12) &&
           (local_48.data[5] == 0x31)) && (local_48.data[6] == 0x2e)) && (local_48.data[7] == 0x31))
      goto LAB_001507fd;
    }
    else {
      if ((FVar4 & 1) == 0) {
        uVar8 = (uint)FVar4 & 6;
        in_RCX = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),0x28);
        switch(uVar8) {
        case 0:
switchD_00150846_caseD_0:
          in_RCX = (uint *)(ulong)*(byte *)(FVar4 & 0xfffffffffffffff8);
          break;
        case 4:
switchD_00150846_caseD_4:
          in_RCX = (uint *)0x2a;
          break;
        case 6:
          if ((char)FVar4 == '&') {
            local_48.data = anon_var_dwarf_21a;
            local_48.len._0_4_ = 5;
          }
          else {
            uVar9 = (uint)FVar4 & 0xff;
            if (uVar9 == 0x16) {
              local_48.data = anon_var_dwarf_225;
              local_48.len._0_4_ = 4;
            }
            else {
              if (uVar9 != 6) {
                switch(uVar8) {
                case 0:
                  goto switchD_00150846_caseD_0;
                case 4:
                  goto switchD_00150846_caseD_4;
                case 6:
                  in_RCX = (uint *)(FVar4 & 0xffffffff);
                }
                break;
              }
              local_48.data = anon_var_dwarf_20f;
              local_48.len._0_4_ = 4;
            }
          }
          local_48.capa._0_4_ = 0;
          local_48.capa._4_4_ = 0;
          local_48.len._4_4_ = 0;
          goto LAB_00150aac;
        }
        switch((uint)in_RCX & 0xff) {
        case 0x27:
          pfVar7 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          pfVar7 = &FIOBJECT_VTABLE_STRING;
          break;
        case 0x29:
          pfVar7 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          pfVar7 = &FIOBJECT_VTABLE_HASH;
          break;
        case 0x2b:
          pfVar7 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar7 = &FIOBJECT_VTABLE_NUMBER;
        }
        (*pfVar7->to_str)(&local_48,FVar4);
        in_RCX = (uint *)pfVar7;
      }
      else {
        fio_ltocstr(&local_48,(long)FVar4 >> 1);
      }
LAB_00150aac:
      if ((((byte *)local_48.data == (byte *)0x0) ||
          (CONCAT44(local_48.len._4_4_,(undefined4)local_48.len) == 0)) ||
         ((byte)(*local_48.data | 0x20U) == 0x6b)) goto LAB_001507fd;
    }
    fiobj_str_write(local_28[0],"connection:close\r\n",0x12);
    task = extraout_RDX_03;
  }
  else {
    if ((FVar4 & 1) == 0) {
      uVar8 = (uint)FVar4 & 6;
      task = (_func_int_FIOBJ_void_ptr *)(ulong)uVar8;
      in_RCX = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),0x28);
      switch(uVar8) {
      case 0:
switchD_001506db_caseD_0:
        in_RCX = (uint *)(ulong)*(byte *)(FVar4 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_001506db_caseD_4:
        in_RCX = (uint *)0x2a;
        break;
      case 6:
        if ((char)FVar4 == '&') {
          local_48.data = anon_var_dwarf_21a;
          local_48.len._0_4_ = 5;
        }
        else {
          uVar9 = (uint)FVar4 & 0xff;
          if (uVar9 == 0x16) {
            local_48.data = anon_var_dwarf_225;
            local_48.len._0_4_ = 4;
          }
          else {
            if (uVar9 != 6) {
              switch(uVar8) {
              case 0:
                goto switchD_001506db_caseD_0;
              case 4:
                goto switchD_001506db_caseD_4;
              case 6:
                in_RCX = (uint *)(FVar4 & 0xffffffff);
              }
              break;
            }
            local_48.data = anon_var_dwarf_20f;
            local_48.len._0_4_ = 4;
          }
        }
        local_48.capa._0_4_ = 0;
        local_48.capa._4_4_ = 0;
        local_48.len._4_4_ = 0;
        goto LAB_001509bf;
      }
      switch((uint)in_RCX & 0xff) {
      case 0x27:
        pfVar7 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        pfVar7 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar7 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        pfVar7 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar7 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar7 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar7->to_str)(&local_48,FVar4);
      in_RCX = (uint *)pfVar7;
      task = extraout_RDX_02;
    }
    else {
      fio_ltocstr(&local_48,(long)FVar4 >> 1);
      task = extraout_RDX_01;
    }
LAB_001509bf:
    if ((byte)(*local_48.data | 0x20U) != 99) goto LAB_00150bd8;
  }
  *(undefined1 *)(uVar1 + 0x100) = 1;
LAB_00150bd8:
  fiobj_each1((h->private_data).out_headers,(size_t)local_28,task,in_RCX);
  fiobj_str_write(local_28[0],"\r\n",2);
  return local_28[0];
}

Assistant:

static FIOBJ headers2str(http_s *h, uintptr_t padding) {
  if (!h->method && !!h->status_str)
    return FIOBJ_INVALID;

  static uintptr_t connection_hash;
  if (!connection_hash)
    connection_hash = fiobj_hash_string("connection", 10);

  struct header_writer_s w;
  {
    const uintptr_t header_length_guess =
        fiobj_hash_count(h->private_data.out_headers) * 64;
    w.dest = fiobj_str_buf(header_length_guess + padding);
  }
  http1pr_s *p = handle2pr(h);

  if (p->is_client == 0) {
    fio_str_info_s t = http1pr_status2str(h->status);
    fiobj_str_write(w.dest, t.data, t.len);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, connection_hash);
    if (tmp) {
      t = fiobj_obj2cstr(tmp);
      if (t.data[0] == 'c' || t.data[0] == 'C')
        p->close = 1;
    } else {
      tmp = fiobj_hash_get2(h->headers, connection_hash);
      if (tmp) {
        t = fiobj_obj2cstr(tmp);
        if (!t.data || !t.len || t.data[0] == 'k' || t.data[0] == 'K')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      } else {
        t = fiobj_obj2cstr(h->version);
        if (!p->close && t.len > 7 && t.data && t.data[5] == '1' &&
            t.data[6] == '.' && t.data[7] == '1')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      }
    }
  } else {
    if (h->method) {
      fiobj_str_join(w.dest, h->method);
      fiobj_str_write(w.dest, " ", 1);
    } else {
      fiobj_str_write(w.dest, "GET ", 4);
    }
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    fiobj_str_write(w.dest, " HTTP/1.1\r\n", 11);
    /* make sure we have a host header? */
    static uint64_t host_hash;
    if (!host_hash)
      host_hash = fiobj_hash_string("host", 4);
    FIOBJ tmp;
    if (!fiobj_hash_get2(h->private_data.out_headers, host_hash) &&
        (tmp = fiobj_hash_get2(h->headers, host_hash))) {
      fiobj_str_write(w.dest, "host:", 5);
      fiobj_str_join(w.dest, tmp);
      fiobj_str_write(w.dest, "\r\n", 2);
    }
    if (!fiobj_hash_get2(h->private_data.out_headers, connection_hash))
      fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
  }

  fiobj_each1(h->private_data.out_headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  return w.dest;
}